

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_args.cpp
# Opt level: O3

Result<void> *
ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *argsman,
                   CChainParams *chainparams,MemPoolOptions *mempool_opts)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  string_view source_file;
  string_view source_file_00;
  bool bVar6;
  int64_t iVar7;
  Logger *pLVar8;
  MemPoolOptions *strDefault;
  _Alloc_hider _Var9;
  long in_FS_OFFSET;
  optional<long> oVar10;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  string log_msg;
  size_type __dnew;
  FeeEstimateMode local_240 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  long local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  string local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  bilingual_str local_1d8;
  bilingual_str local_198;
  string local_158;
  bilingual_str local_138;
  bilingual_str local_f8;
  string local_98;
  string local_78;
  string local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  paVar2 = &local_218.field_2;
  strDefault = mempool_opts;
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-checkmempool","");
  iVar7 = ArgsManager::GetIntArg(argsman,&local_218,(long)mempool_opts->check_ratio);
  mempool_opts->check_ratio = (int)iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-maxmempool","");
  oVar10 = ArgsManager::GetIntArg(argsman,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if (((undefined1  [16])
       oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    mempool_opts->max_size_bytes =
         oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload * 1000000;
  }
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-mempoolexpiry","");
  oVar10 = ArgsManager::GetIntArg(argsman,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if (((undefined1  [16])
       oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (mempool_opts->expiry).__r =
         oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload * 0xe10;
  }
  local_218._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-incrementalrelayfee","");
  bVar6 = ArgsManager::IsArgSet(argsman,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar2) {
    operator_delete(local_218._M_dataplus._M_p,(ulong)(local_218.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar6) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-incrementalrelayfee","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    strDefault = (MemPoolOptions *)&local_78;
    ArgsManager::GetArg(&local_218,argsman,&local_58,(string *)strDefault);
    oVar10 = ParseMoney(&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])
         oVar10.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (mempool_opts->incremental_relay_feerate).nSatoshisPerK =
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      goto LAB_00262870;
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"incrementalrelayfee","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-incrementalrelayfee","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
    common::AmountErrMsg(&local_f8,&local_218,&local_58);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    paVar3 = &local_f8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.original._M_dataplus._M_p == paVar3) {
      *puVar1 = CONCAT71(local_f8.original.field_2._M_allocated_capacity._1_7_,
                         local_f8.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
           local_f8.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> =
           local_f8.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(local_f8.original.field_2._M_allocated_capacity._1_7_,
                    local_f8.original.field_2._M_local_buf[0]);
    }
    paVar4 = &local_f8.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
         local_f8.original._M_string_length;
    local_f8.original._M_string_length = 0;
    local_f8.original.field_2._M_local_buf[0] = '\0';
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p == paVar4) {
      *puVar1 = CONCAT71(local_f8.translated.field_2._M_allocated_capacity._1_7_,
                         local_f8.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
           local_f8.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
           local_f8.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(local_f8.translated.field_2._M_allocated_capacity._1_7_,
                    local_f8.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
         local_f8.translated._M_string_length;
    local_f8.translated._M_string_length = 0;
    local_f8.translated.field_2._M_local_buf[0] = '\0';
    local_f8.original._M_dataplus._M_p = (pointer)paVar3;
    local_f8.translated._M_dataplus._M_p = (pointer)paVar4;
LAB_002633e4:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_228._M_allocated_capacity = local_218.field_2._M_allocated_capacity;
    _Var9._M_p = local_218._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p == paVar2) goto LAB_00263465;
  }
  else {
LAB_00262870:
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-minrelaytxfee","");
    bVar6 = ArgsManager::IsArgSet(argsman,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if (bVar6) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-minrelaytxfee","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      strDefault = (MemPoolOptions *)&local_78;
      ArgsManager::GetArg(&local_218,argsman,&local_58,(string *)strDefault);
      oVar10 = ParseMoney(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"minrelaytxfee","");
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-minrelaytxfee","");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
        common::AmountErrMsg(&local_138,&local_218,&local_58);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
        paVar3 = &local_138.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.original._M_dataplus._M_p == paVar3) {
          *puVar1 = CONCAT71(local_138.original.field_2._M_allocated_capacity._1_7_,
                             local_138.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
               local_138.original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> =
               local_138.original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(local_138.original.field_2._M_allocated_capacity._1_7_,
                        local_138.original.field_2._M_local_buf[0]);
        }
        paVar4 = &local_138.translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
             local_138.original._M_string_length;
        local_138.original._M_string_length = 0;
        local_138.original.field_2._M_local_buf[0] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138.translated._M_dataplus._M_p == paVar4) {
          *puVar1 = CONCAT71(local_138.translated.field_2._M_allocated_capacity._1_7_,
                             local_138.translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
               local_138.translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
               local_138.translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(local_138.translated.field_2._M_allocated_capacity._1_7_,
                        local_138.translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
             local_138.translated._M_string_length;
        local_138.translated._M_string_length = 0;
        local_138.translated.field_2._M_local_buf[0] = '\0';
        local_138.original._M_dataplus._M_p = (pointer)paVar3;
        local_138.translated._M_dataplus._M_p = (pointer)paVar4;
        goto LAB_002633e4;
      }
      (mempool_opts->min_relay_feerate).nSatoshisPerK =
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    else {
      lVar5 = (mempool_opts->incremental_relay_feerate).nSatoshisPerK;
      if ((mempool_opts->min_relay_feerate).nSatoshisPerK < lVar5) {
        (mempool_opts->min_relay_feerate).nSatoshisPerK = lVar5;
        local_240[0] = BTC_KVB;
        CFeeRate::ToString_abi_cxx11_(&local_158,&mempool_opts->min_relay_feerate,local_240);
        pLVar8 = LogInstance();
        bVar6 = BCLog::Logger::Enabled(pLVar8);
        if (bVar6) {
          local_218._M_string_length = 0;
          local_218.field_2._M_allocated_capacity =
               local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_218._M_dataplus._M_p = (pointer)paVar2;
          tinyformat::format<std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)"Increasing minrelaytxfee to %s to match incrementalrelayfee\n",
                     (char *)&local_158,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault
                    );
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_218,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          pLVar8 = LogInstance();
          local_58._M_dataplus._M_p = (pointer)0x5e;
          local_58._M_string_length = 0x81bb99;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_args.cpp"
          ;
          source_file._M_len = 0x5e;
          str._M_str = local_218._M_dataplus._M_p;
          str._M_len = local_218._M_string_length;
          logging_function._M_str = "ApplyArgsManOptions";
          logging_function._M_len = 0x13;
          strDefault = (MemPoolOptions *)0x13;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x45,ALL,Info);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar2) {
            operator_delete(local_218._M_dataplus._M_p,
                            (ulong)(local_218.field_2._M_allocated_capacity + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-dustrelayfee","");
    bVar6 = ArgsManager::IsArgSet(argsman,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if (bVar6) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-dustrelayfee","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      strDefault = (MemPoolOptions *)&local_78;
      ArgsManager::GetArg(&local_218,argsman,&local_58,(string *)strDefault);
      oVar10 = ParseMoney(&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_218._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"dustrelayfee","");
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-dustrelayfee","");
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        ArgsManager::GetArg(&local_58,argsman,&local_78,&local_98);
        common::AmountErrMsg(&local_198,&local_218,&local_58);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
        paVar3 = &local_198.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.original._M_dataplus._M_p == paVar3) {
          *puVar1 = CONCAT71(local_198.original.field_2._M_allocated_capacity._1_7_,
                             local_198.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
               local_198.original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> =
               local_198.original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(local_198.original.field_2._M_allocated_capacity._1_7_,
                        local_198.original.field_2._M_local_buf[0]);
        }
        paVar4 = &local_198.translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
             local_198.original._M_string_length;
        local_198.original._M_string_length = 0;
        local_198.original.field_2._M_local_buf[0] = '\0';
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198.translated._M_dataplus._M_p == paVar4) {
          *puVar1 = CONCAT71(local_198.translated.field_2._M_allocated_capacity._1_7_,
                             local_198.translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
               local_198.translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
               local_198.translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(local_198.translated.field_2._M_allocated_capacity._1_7_,
                        local_198.translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
             local_198.translated._M_string_length;
        local_198.translated._M_string_length = 0;
        local_198.translated.field_2._M_local_buf[0] = '\0';
        local_198.original._M_dataplus._M_p = (pointer)paVar3;
        local_198.translated._M_dataplus._M_p = (pointer)paVar4;
        goto LAB_002633e4;
      }
      (mempool_opts->dust_relay_feerate).nSatoshisPerK =
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-permitbaremultisig","");
    bVar6 = ArgsManager::GetBoolArg(argsman,&local_218,true);
    mempool_opts->permit_bare_multisig = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-datacarrier","");
    bVar6 = ArgsManager::GetBoolArg(argsman,&local_218,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if (bVar6) {
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-datacarriersize","");
      iVar7 = ArgsManager::GetIntArg(argsman,&local_218,0x53);
      if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = true;
      }
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value = (uint)iVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
    }
    else if ((mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
             _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      (mempool_opts->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = false;
    }
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-acceptnonstdtxn","");
    bVar6 = ArgsManager::GetBoolArg(argsman,&local_218,false);
    mempool_opts->require_standard = !bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    if ((chainparams->m_chain_type != MAIN) || (mempool_opts->require_standard != false)) {
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-mempoolfullrbf","");
      bVar6 = ArgsManager::GetBoolArg(argsman,&local_218,mempool_opts->full_rbf);
      mempool_opts->full_rbf = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p == paVar2) {
        if (!bVar6) goto LAB_00262f59;
      }
      else {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
        if ((mempool_opts->full_rbf & 1U) == 0) {
LAB_00262f59:
          pLVar8 = LogInstance();
          bVar6 = BCLog::Logger::Enabled(pLVar8);
          if (bVar6) {
            local_218._M_string_length = 0;
            local_218.field_2._M_allocated_capacity =
                 local_218.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_218._M_dataplus._M_p = (pointer)paVar2;
            tinyformat::format<>
                      (&local_58,
                       "Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n"
                      );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_218,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            pLVar8 = LogInstance();
            local_58._M_dataplus._M_p = (pointer)0x5e;
            local_58._M_string_length = 0x81bb99;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_args.cpp"
            ;
            source_file_00._M_len = 0x5e;
            str_00._M_str = local_218._M_dataplus._M_p;
            str_00._M_len = local_218._M_string_length;
            logging_function_00._M_str = "ApplyArgsManOptions";
            logging_function_00._M_len = 0x13;
            BCLog::Logger::LogPrintStr
                      (pLVar8,str_00,logging_function_00,source_file_00,0x61,ALL,Info);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != paVar2) {
              operator_delete(local_218._M_dataplus._M_p,
                              (ulong)(local_218.field_2._M_allocated_capacity + 1));
            }
          }
        }
      }
      local_218._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"-persistmempoolv1","");
      bVar6 = ArgsManager::GetBoolArg(argsman,&local_218,mempool_opts->persist_v1_dat);
      mempool_opts->persist_v1_dat = bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      local_58._M_dataplus._M_p = (pointer)0x13;
      local_218._M_dataplus._M_p = (pointer)paVar2;
      local_218._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_218,(size_type *)&local_58,0);
      local_218.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
      builtin_strncpy(local_218._M_dataplus._M_p,"-limitancestorcount",0x13);
      local_218._M_string_length = (size_type)local_58._M_dataplus._M_p;
      local_218._M_dataplus._M_p[local_58._M_dataplus._M_p] = '\0';
      iVar7 = ArgsManager::GetIntArg(argsman,&local_218,(mempool_opts->limits).ancestor_count);
      (mempool_opts->limits).ancestor_count = iVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p = (pointer)0x12;
      local_218._M_dataplus._M_p = (pointer)paVar2;
      local_218._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_218,(size_type *)&local_58,0);
      local_218.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
      builtin_strncpy(local_218._M_dataplus._M_p,"-limitancestorsize",0x12);
      local_218._M_string_length = (size_type)local_58._M_dataplus._M_p;
      local_218._M_dataplus._M_p[local_58._M_dataplus._M_p] = '\0';
      oVar10 = ArgsManager::GetIntArg(argsman,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).ancestor_size_vbytes =
             oVar10.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      local_58._M_dataplus._M_p = (pointer)0x15;
      local_218._M_dataplus._M_p = (pointer)paVar2;
      local_218._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_218,(size_type *)&local_58,0);
      local_218.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
      builtin_strncpy(local_218._M_dataplus._M_p,"-limitdescendantcount",0x15);
      local_218._M_string_length = (size_type)local_58._M_dataplus._M_p;
      local_218._M_dataplus._M_p[local_58._M_dataplus._M_p] = '\0';
      iVar7 = ArgsManager::GetIntArg(argsman,&local_218,(mempool_opts->limits).descendant_count);
      (mempool_opts->limits).descendant_count = iVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p = (pointer)0x14;
      local_218._M_dataplus._M_p = (pointer)paVar2;
      local_218._M_dataplus._M_p =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_create(&local_218,(size_type *)&local_58,0);
      local_218.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
      *(undefined8 *)local_218._M_dataplus._M_p = 0x656474696d696c2d;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 8) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 9) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0xb) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0xc) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0xe) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0xf) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0x10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0x11) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0x12) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p + 0x13) = 'e';
      local_218._M_string_length = (size_type)local_58._M_dataplus._M_p;
      local_218._M_dataplus._M_p[local_58._M_dataplus._M_p] = '\0';
      oVar10 = ArgsManager::GetIntArg(argsman,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar2) {
        operator_delete(local_218._M_dataplus._M_p,
                        (ulong)(local_218.field_2._M_allocated_capacity + 1));
      }
      if (((undefined1  [16])
           oVar10.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (mempool_opts->limits).descendant_size_vbytes =
             oVar10.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload * 1000;
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
      goto LAB_00263465;
    }
    local_238 = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,"acceptnonstdtxn is not currently supported for %s chain","");
    local_218._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_238,local_238->_M_local_buf + local_230);
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f8,local_238,local_238->_M_local_buf + local_230);
    ChainTypeToString_abi_cxx11_(&local_58,chainparams->m_chain_type);
    tinyformat::format<std::__cxx11::string>
              (&local_1d8,(tinyformat *)&local_218,(bilingual_str *)&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar1;
    paVar3 = &local_1d8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.original._M_dataplus._M_p == paVar3) {
      *puVar1 = CONCAT71(local_1d8.original.field_2._M_allocated_capacity._1_7_,
                         local_1d8.original.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
           local_1d8.original.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> =
           local_1d8.original._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
           CONCAT71(local_1d8.original.field_2._M_allocated_capacity._1_7_,
                    local_1d8.original.field_2._M_local_buf[0]);
    }
    paVar4 = &local_1d8.translated.field_2;
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
         local_1d8.original._M_string_length;
    local_1d8.original._M_string_length = 0;
    local_1d8.original.field_2._M_local_buf[0] = '\0';
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.translated._M_dataplus._M_p == paVar4) {
      *puVar1 = CONCAT71(local_1d8.translated.field_2._M_allocated_capacity._1_7_,
                         local_1d8.translated.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
           local_1d8.translated.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
           local_1d8.translated._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                        super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
           CONCAT71(local_1d8.translated.field_2._M_allocated_capacity._1_7_,
                    local_1d8.translated.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
         local_1d8.translated._M_string_length;
    local_1d8.translated._M_string_length = 0;
    local_1d8.translated.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
             super__Move_assign_alias<bilingual_str,_std::monostate>.
             super__Copy_assign_alias<bilingual_str,_std::monostate>.
             super__Move_ctor_alias<bilingual_str,_std::monostate>.
             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
             super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
    local_1d8.original._M_dataplus._M_p = (pointer)paVar3;
    local_1d8.translated._M_dataplus._M_p = (pointer)paVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar2) {
      operator_delete(local_218._M_dataplus._M_p,
                      (ulong)(local_218.field_2._M_allocated_capacity + 1));
    }
    _Var9._M_p = (pointer)local_238;
    if (local_238 == &local_228) goto LAB_00263465;
  }
  operator_delete(_Var9._M_p,(ulong)(local_228._M_allocated_capacity + 1));
LAB_00263465:
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& argsman, const CChainParams& chainparams, MemPoolOptions& mempool_opts)
{
    mempool_opts.check_ratio = argsman.GetIntArg("-checkmempool", mempool_opts.check_ratio);

    if (auto mb = argsman.GetIntArg("-maxmempool")) mempool_opts.max_size_bytes = *mb * 1'000'000;

    if (auto hours = argsman.GetIntArg("-mempoolexpiry")) mempool_opts.expiry = std::chrono::hours{*hours};

    // incremental relay fee sets the minimum feerate increase necessary for replacement in the mempool
    // and the amount the mempool min fee increases above the feerate of txs evicted due to mempool limiting.
    if (argsman.IsArgSet("-incrementalrelayfee")) {
        if (std::optional<CAmount> inc_relay_fee = ParseMoney(argsman.GetArg("-incrementalrelayfee", ""))) {
            mempool_opts.incremental_relay_feerate = CFeeRate{inc_relay_fee.value()};
        } else {
            return util::Error{AmountErrMsg("incrementalrelayfee", argsman.GetArg("-incrementalrelayfee", ""))};
        }
    }

    if (argsman.IsArgSet("-minrelaytxfee")) {
        if (std::optional<CAmount> min_relay_feerate = ParseMoney(argsman.GetArg("-minrelaytxfee", ""))) {
            // High fee check is done afterward in CWallet::Create()
            mempool_opts.min_relay_feerate = CFeeRate{min_relay_feerate.value()};
        } else {
            return util::Error{AmountErrMsg("minrelaytxfee", argsman.GetArg("-minrelaytxfee", ""))};
        }
    } else if (mempool_opts.incremental_relay_feerate > mempool_opts.min_relay_feerate) {
        // Allow only setting incremental fee to control both
        mempool_opts.min_relay_feerate = mempool_opts.incremental_relay_feerate;
        LogPrintf("Increasing minrelaytxfee to %s to match incrementalrelayfee\n", mempool_opts.min_relay_feerate.ToString());
    }

    // Feerate used to define dust.  Shouldn't be changed lightly as old
    // implementations may inadvertently create non-standard transactions
    if (argsman.IsArgSet("-dustrelayfee")) {
        if (std::optional<CAmount> parsed = ParseMoney(argsman.GetArg("-dustrelayfee", ""))) {
            mempool_opts.dust_relay_feerate = CFeeRate{parsed.value()};
        } else {
            return util::Error{AmountErrMsg("dustrelayfee", argsman.GetArg("-dustrelayfee", ""))};
        }
    }

    mempool_opts.permit_bare_multisig = argsman.GetBoolArg("-permitbaremultisig", DEFAULT_PERMIT_BAREMULTISIG);

    if (argsman.GetBoolArg("-datacarrier", DEFAULT_ACCEPT_DATACARRIER)) {
        mempool_opts.max_datacarrier_bytes = argsman.GetIntArg("-datacarriersize", MAX_OP_RETURN_RELAY);
    } else {
        mempool_opts.max_datacarrier_bytes = std::nullopt;
    }

    mempool_opts.require_standard = !argsman.GetBoolArg("-acceptnonstdtxn", DEFAULT_ACCEPT_NON_STD_TXN);
    if (!chainparams.IsTestChain() && !mempool_opts.require_standard) {
        return util::Error{strprintf(Untranslated("acceptnonstdtxn is not currently supported for %s chain"), chainparams.GetChainTypeString())};
    }

    mempool_opts.full_rbf = argsman.GetBoolArg("-mempoolfullrbf", mempool_opts.full_rbf);
    if (!mempool_opts.full_rbf) {
        LogInfo("Warning: mempoolfullrbf=0 set but deprecated and will be removed in a future release\n");
    }

    mempool_opts.persist_v1_dat = argsman.GetBoolArg("-persistmempoolv1", mempool_opts.persist_v1_dat);

    ApplyArgsManOptions(argsman, mempool_opts.limits);

    return {};
}